

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::changeEvent(QMenu *this,QEvent *e)

{
  long lVar1;
  QMenuScroller *pQVar2;
  bool bVar3;
  Type TVar4;
  int iVar5;
  QMenuPrivate *pQVar6;
  QStyle *pQVar7;
  QPlatformMenu *pQVar8;
  QSize *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QMenuPrivate *d;
  QWidget *in_stack_ffffffffffffffa8;
  undefined1 uVar9;
  QWidget *in_stack_ffffffffffffffb0;
  QEvent *in_stack_ffffffffffffffb8;
  QWidget *in_stack_ffffffffffffffc0;
  QWidget *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar6 = d_func((QMenu *)0x64b14f);
  TVar4 = QEvent::type((QEvent *)in_RSI);
  if (((TVar4 == StyleChange) || (TVar4 = QEvent::type((QEvent *)in_RSI), TVar4 == FontChange)) ||
     (TVar4 = QEvent::type((QEvent *)in_RSI), TVar4 == LayoutDirectionChange)) {
    *(ushort *)&pQVar6->field_0x420 = *(ushort *)&pQVar6->field_0x420 & 0xfffe | 1;
    pQVar7 = QWidget::style(in_stack_ffffffffffffffa8);
    (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x14,0,in_RDI);
    QWidget::setMouseTracking
              (in_stack_ffffffffffffffb0,SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
    bVar3 = QWidget::isVisible((QWidget *)0x64b1e8);
    if (bVar3) {
      (**(code **)(*(long *)in_RDI + 0x70))();
      QWidget::resize(this_00,in_RSI);
    }
    pQVar7 = QWidget::style(in_stack_ffffffffffffffa8);
    iVar5 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x1e,0,in_RDI);
    if (iVar5 == 0) {
      pQVar2 = pQVar6->scroll;
      if (pQVar2 != (QMenuScroller *)0x0) {
        QMenuPrivate::QMenuScroller::~QMenuScroller((QMenuScroller *)0x64b25b);
        operator_delete(pQVar2,0xc);
      }
      pQVar6->scroll = (QMenuScroller *)0x0;
    }
    else if (pQVar6->scroll == (QMenuScroller *)0x0) {
      in_stack_ffffffffffffffc0 = (QWidget *)operator_new(0xc);
      QMenuPrivate::QMenuScroller::QMenuScroller((QMenuScroller *)in_stack_ffffffffffffffb0);
      pQVar6->scroll = (QMenuScroller *)in_stack_ffffffffffffffc0;
      pQVar6->scroll->scrollFlags = '\0';
    }
  }
  else {
    TVar4 = QEvent::type((QEvent *)in_RSI);
    if (TVar4 == EnabledChange) {
      bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QTornOffMenu> *)0x64b2ee);
      if (bVar3) {
        in_stack_ffffffffffffffb8 =
             (QEvent *)QPointer<QTornOffMenu>::operator->((QPointer<QTornOffMenu> *)0x64b305);
        QWidget::isEnabled((QWidget *)0x64b314);
        QWidget::setEnabled(in_stack_ffffffffffffffc0,
                            SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
      }
      uVar9 = SUB81(pQVar6->menuAction,0);
      QWidget::isEnabled((QWidget *)0x64b33f);
      QAction::setEnabled((bool)uVar9);
      bVar3 = QPointer<QPlatformMenu>::isNull((QPointer<QPlatformMenu> *)0x64b360);
      if (!bVar3) {
        pQVar8 = QPointer<QPlatformMenu>::operator->((QPointer<QPlatformMenu> *)0x64b375);
        bVar3 = QWidget::isEnabled((QWidget *)0x64b383);
        (**(code **)(*(long *)pQVar8 + 0xa0))(pQVar8,bVar3);
      }
    }
  }
  QWidget::changeEvent(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::changeEvent(QEvent *e)
{
    Q_D(QMenu);
    if (e->type() == QEvent::StyleChange || e->type() == QEvent::FontChange ||
        e->type() == QEvent::LayoutDirectionChange) {
        d->itemsDirty = 1;
        setMouseTracking(style()->styleHint(QStyle::SH_Menu_MouseTracking, nullptr, this));
        if (isVisible())
            resize(sizeHint());
        if (!style()->styleHint(QStyle::SH_Menu_Scrollable, nullptr, this)) {
            delete d->scroll;
            d->scroll = nullptr;
        } else if (!d->scroll) {
            d->scroll = new QMenuPrivate::QMenuScroller;
            d->scroll->scrollFlags = QMenuPrivate::QMenuScroller::ScrollNone;
        }
    } else if (e->type() == QEvent::EnabledChange) {
        if (d->tornPopup) // torn-off menu
            d->tornPopup->setEnabled(isEnabled());
        d->menuAction->setEnabled(isEnabled());
        if (!d->platformMenu.isNull())
            d->platformMenu->setEnabled(isEnabled());
    }
    QWidget::changeEvent(e);
}